

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Resolution * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl::getResolutionAtReturnTime
          (Resolution *__return_storage_ptr__,RpcServerResponseImpl *this,
          ArrayPtr<const_capnp::PipelineOp> ops)

{
  ClientHook *pCVar1;
  Own<capnp::ClientHook,_std::nullptr_t> *pOVar2;
  ArrayPtr<const_capnp::PipelineOp> ops_00;
  Own<capnp::ClientHook,_std::nullptr_t> local_e8;
  Own<capnp::ClientHook,_std::nullptr_t> local_d8;
  Own<capnp::ClientHook,_std::nullptr_t> *local_c8;
  Own<capnp::ClientHook,_std::nullptr_t> *u;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_&> local_b8;
  Own<capnp::ClientHook,_std::nullptr_t> *local_b0;
  Own<capnp::ClientHook,_std::nullptr_t> *_u2934;
  undefined1 local_98 [8];
  Own<capnp::ClientHook,_std::nullptr_t> unwrapped;
  Builder local_70;
  PipelineOp local_58 [4];
  undefined1 local_38 [8];
  Own<capnp::ClientHook,_std::nullptr_t> returnedCap;
  RpcServerResponseImpl *this_local;
  ArrayPtr<const_capnp::PipelineOp> ops_local;
  
  ops_00.size_ = (ClientHook *)ops.ptr;
  returnedCap.ptr = (ClientHook *)this;
  getResultsBuilder(&local_70,this);
  AnyPointer::Builder::asReader((Reader *)local_58,&local_70);
  ops_00.ptr = local_58;
  unwrapped.ptr = ops_00.size_;
  AnyPointer::Reader::getPipelinedCap((Reader *)local_38,ops_00);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::Own
            ((Own<capnp::ClientHook,_std::nullptr_t> *)local_98);
  u = (Own<capnp::ClientHook,_std::nullptr_t> *)
      kj::Own<capnp::ClientHook,_std::nullptr_t>::get
                ((Own<capnp::ClientHook,_std::nullptr_t> *)local_38);
  kj::HashMap<capnp::ClientHook*,kj::Own<capnp::ClientHook,decltype(nullptr)>>::
  find<capnp::ClientHook*>
            ((HashMap<capnp::ClientHook*,kj::Own<capnp::ClientHook,decltype(nullptr)>> *)&local_b8,
             (ClientHook **)&this->resolutionsAtReturnTime);
  local_b0 = kj::_::readMaybe<kj::Own<capnp::ClientHook,decltype(nullptr)>>(&local_b8);
  if (local_b0 == (Own<capnp::ClientHook,_std::nullptr_t> *)0x0) {
    pCVar1 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->
                       ((Own<capnp::ClientHook,_std::nullptr_t> *)local_38);
    (*pCVar1->_vptr_ClientHook[4])(&local_e8);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::operator=
              ((Own<capnp::ClientHook,_std::nullptr_t> *)local_98,&local_e8);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_e8);
  }
  else {
    local_c8 = local_b0;
    pCVar1 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(local_b0);
    (*pCVar1->_vptr_ClientHook[4])(&local_d8);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::operator=
              ((Own<capnp::ClientHook,_std::nullptr_t> *)local_98,&local_d8);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_d8);
  }
  pOVar2 = kj::mv<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                     ((Own<capnp::ClientHook,_std::nullptr_t> *)local_38);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::Own(&__return_storage_ptr__->returnedCap,pOVar2);
  pOVar2 = kj::mv<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                     ((Own<capnp::ClientHook,_std::nullptr_t> *)local_98);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::Own(&__return_storage_ptr__->unwrapped,pOVar2);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
            ((Own<capnp::ClientHook,_std::nullptr_t> *)local_98);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
            ((Own<capnp::ClientHook,_std::nullptr_t> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Resolution getResolutionAtReturnTime(kj::ArrayPtr<const PipelineOp> ops) {
      auto returnedCap = getResultsBuilder().asReader().getPipelinedCap(ops);
      kj::Own<ClientHook> unwrapped;
      KJ_IF_SOME(u, resolutionsAtReturnTime.find(returnedCap.get())) {
        unwrapped = u->addRef();
      } else {
        unwrapped = returnedCap->addRef();
      }